

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_div_mpi(mbedtls_mpi *Q,mbedtls_mpi *R,mbedtls_mpi *A,mbedtls_mpi *B)

{
  long lVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  mbedtls_mpi_uint mVar6;
  ulong uVar7;
  int iVar8;
  undefined1 auVar9 [16];
  mbedtls_mpi_uint p_1 [1];
  mbedtls_mpi Z;
  mbedtls_mpi X;
  mbedtls_mpi Y;
  mbedtls_mpi T1;
  mbedtls_mpi Y_1;
  mbedtls_mpi T2;
  ulong local_f8;
  undefined1 local_f0 [24];
  long local_d8;
  undefined8 *puStack_d0;
  mbedtls_mpi local_c8;
  mbedtls_mpi local_b0;
  ulong local_98;
  mbedtls_mpi local_90;
  mbedtls_mpi local_78;
  ulong local_60;
  ulong local_58;
  mbedtls_mpi local_50;
  ulong local_38;
  
  local_78.p = (mbedtls_mpi_uint *)&local_c8;
  local_c8.s = 0;
  local_c8._4_4_ = 0;
  local_78.s = 1;
  local_78.n = 1;
  iVar2 = mbedtls_mpi_cmp_mpi(B,&local_78);
  if (iVar2 == 0) {
    return -0xc;
  }
  local_c8.s = 1;
  local_c8.n = 0;
  local_c8.p = (mbedtls_mpi_uint *)0x0;
  local_b0.s = 1;
  local_b0.n = 0;
  local_b0.p = (mbedtls_mpi_uint *)0x0;
  local_f0._16_4_ = 1;
  local_d8 = 0;
  puStack_d0 = (undefined8 *)0x0;
  local_90.s = 1;
  local_90.n = 0;
  local_90.p = (mbedtls_mpi_uint *)0x0;
  local_50.s = 1;
  local_50.n = 0;
  local_50.p = (mbedtls_mpi_uint *)0x0;
  iVar2 = mbedtls_mpi_cmp_abs(A,B);
  if (iVar2 < 0) {
    if (Q != (mbedtls_mpi *)0x0) {
      iVar2 = mbedtls_mpi_grow(Q,1);
      if (iVar2 != 0) goto LAB_00162e3a;
      memset(Q->p,0,Q->n << 3);
      *Q->p = 0;
      Q->s = 1;
    }
    if (R == (mbedtls_mpi *)0x0) {
      return 0;
    }
    iVar2 = mbedtls_mpi_copy(R,A);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    iVar2 = mbedtls_mpi_copy(&local_c8,A);
    if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_copy(&local_b0,B), iVar2 == 0)) {
      local_b0.s = 1;
      local_c8.s = 1;
      iVar2 = mbedtls_mpi_grow((mbedtls_mpi *)(local_f0 + 0x10),A->n + 2);
      if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_grow((mbedtls_mpi *)(local_f0 + 0x10),1), iVar2 == 0)
         ) {
        memset(puStack_d0,0,local_d8 << 3);
        *puStack_d0 = 0;
        local_f0._16_4_ = 1;
        iVar2 = mbedtls_mpi_grow(&local_90,2);
        if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_grow(&local_50,3), iVar2 == 0)) {
          sVar4 = mbedtls_mpi_bitlen(&local_b0);
          uVar5 = (ulong)((uint)sVar4 & 0x3f);
          if (uVar5 == 0x3f) {
            uVar5 = 0;
          }
          else {
            uVar5 = uVar5 ^ 0x3f;
            iVar2 = mbedtls_mpi_shift_l(&local_c8,uVar5);
            if ((iVar2 != 0) || (iVar2 = mbedtls_mpi_shift_l(&local_b0,uVar5), iVar2 != 0))
            goto LAB_00162e3a;
          }
          sVar4 = local_c8.n;
          local_f8 = local_c8.n;
          local_98 = local_b0.n;
          local_f0._8_8_ = local_c8.n - local_b0.n;
          local_58 = local_f0._8_8_ * 0x40;
          iVar2 = mbedtls_mpi_shift_l(&local_b0,local_58);
          if (iVar2 == 0) {
            local_60 = local_98 - 1;
            local_38 = uVar5;
            do {
              iVar2 = mbedtls_mpi_cmp_mpi(&local_c8,&local_b0);
              if (iVar2 < 0) {
                iVar2 = mbedtls_mpi_shift_r(&local_b0,local_58);
                if (iVar2 == 0) {
                  uVar5 = sVar4 - 1;
                  if (uVar5 <= local_60) goto LAB_001631ac;
                  local_58 = ~local_98;
                  goto LAB_00162eed;
                }
                break;
              }
              puStack_d0[local_f0._8_8_] = puStack_d0[local_f0._8_8_] + 1;
              iVar2 = mbedtls_mpi_sub_mpi(&local_c8,&local_c8,&local_b0);
            } while (iVar2 == 0);
          }
        }
      }
    }
  }
  goto LAB_00162e3a;
  while( true ) {
    iVar2 = mbedtls_mpi_shift_l(&local_90,lVar1 * 0x40);
    if ((iVar2 != 0) || (iVar2 = mbedtls_mpi_sub_mpi(&local_c8,&local_c8,&local_90), iVar2 != 0))
    goto LAB_00162e3a;
    local_f0._0_8_ = 0;
    local_78.s = 1;
    local_78.n = 1;
    local_78.p = (mbedtls_mpi_uint *)local_f0;
    iVar2 = mbedtls_mpi_cmp_mpi(&local_c8,&local_78);
    if (iVar2 < 0) {
      iVar2 = mbedtls_mpi_copy(&local_90,&local_b0);
      if (((iVar2 != 0) || (iVar2 = mbedtls_mpi_shift_l(&local_90,lVar1 * 0x40), iVar2 != 0)) ||
         (iVar2 = mbedtls_mpi_add_mpi(&local_c8,&local_c8,&local_90), iVar2 != 0))
      goto LAB_00162e3a;
      puStack_d0[lVar1] = puStack_d0[lVar1] + -1;
    }
    local_f8 = local_f0._8_8_;
    uVar5 = local_f0._8_8_ - 1;
    if (uVar5 <= local_60) break;
LAB_00162eed:
    uVar7 = 0xffffffffffffffff;
    local_f0._8_8_ = uVar5;
    if (local_c8.p[uVar5] < local_b0.p[local_98 - 1]) {
      auVar9 = __udivti3(local_c8.p[local_f8 - 2],local_c8.p[uVar5],local_b0.p[local_98 - 1],0);
      uVar7 = -(ulong)(auVar9._8_8_ != 0) | auVar9._0_8_;
    }
    puStack_d0[local_f8 + local_58] = uVar7;
    lVar1 = local_f8 + local_58;
    puStack_d0[lVar1] = puStack_d0[lVar1] + 1;
    do {
      puStack_d0[lVar1] = puStack_d0[lVar1] + -1;
      iVar2 = mbedtls_mpi_lset(&local_90,0);
      if (iVar2 != 0) goto LAB_00162e3a;
      if (local_60 == 0) {
        mVar6 = 0;
      }
      else {
        mVar6 = local_b0.p[local_98 - 2];
      }
      *local_90.p = mVar6;
      local_90.p[1] = local_b0.p[local_98 - 1];
      local_f0._0_8_ = puStack_d0[lVar1];
      local_78.s = 1;
      local_78.n = 1;
      local_78.p = (mbedtls_mpi_uint *)local_f0;
      iVar2 = mbedtls_mpi_mul_mpi(&local_90,&local_90,&local_78);
      if ((iVar2 != 0) || (iVar2 = mbedtls_mpi_lset(&local_50,0), iVar2 != 0)) goto LAB_00162e3a;
      if ((ulong)local_f0._8_8_ < 2) {
        mVar6 = 0;
      }
      else {
        mVar6 = local_c8.p[local_f8 - 3];
      }
      *local_50.p = mVar6;
      local_50.p[1] = local_c8.p[local_f8 - 2];
      local_50.p[2] = local_c8.p[local_f0._8_8_];
      iVar2 = mbedtls_mpi_cmp_mpi(&local_90,&local_50);
    } while (0 < iVar2);
    local_f0._0_8_ = puStack_d0[lVar1];
    local_78.s = 1;
    local_78.n = 1;
    local_78.p = (mbedtls_mpi_uint *)local_f0;
    iVar2 = mbedtls_mpi_mul_mpi(&local_90,&local_b0,&local_78);
    if (iVar2 != 0) goto LAB_00162e3a;
  }
LAB_001631ac:
  if (Q != (mbedtls_mpi *)0x0) {
    iVar2 = mbedtls_mpi_copy(Q,(mbedtls_mpi *)(local_f0 + 0x10));
    if (iVar2 != 0) goto LAB_00162e3a;
    Q->s = B->s * A->s;
  }
  iVar8 = 0;
  iVar2 = iVar8;
  if ((R != (mbedtls_mpi *)0x0) && (iVar2 = mbedtls_mpi_shift_r(&local_c8,local_38), iVar2 == 0)) {
    local_c8.s = A->s;
    iVar2 = mbedtls_mpi_copy(R,&local_c8);
    if (iVar2 == 0) {
      local_78.p = (mbedtls_mpi_uint *)local_f0;
      local_f0._0_8_ = 0;
      local_78.s = 1;
      local_78.n = 1;
      iVar3 = mbedtls_mpi_cmp_mpi(R,&local_78);
      iVar2 = iVar8;
      if (iVar3 == 0) {
        R->s = 1;
      }
    }
  }
LAB_00162e3a:
  mbedtls_mpi_free(&local_c8);
  mbedtls_mpi_free(&local_b0);
  mbedtls_mpi_free((mbedtls_mpi *)(local_f0 + 0x10));
  mbedtls_mpi_free(&local_90);
  mbedtls_mpi_free(&local_50);
  return iVar2;
}

Assistant:

int mbedtls_mpi_div_mpi( mbedtls_mpi *Q, mbedtls_mpi *R, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret;
    size_t i, n, t, k;
    mbedtls_mpi X, Y, Z, T1, T2;

    if( mbedtls_mpi_cmp_int( B, 0 ) == 0 )
        return( MBEDTLS_ERR_MPI_DIVISION_BY_ZERO );

    mbedtls_mpi_init( &X ); mbedtls_mpi_init( &Y ); mbedtls_mpi_init( &Z );
    mbedtls_mpi_init( &T1 ); mbedtls_mpi_init( &T2 );

    if( mbedtls_mpi_cmp_abs( A, B ) < 0 )
    {
        if( Q != NULL ) MBEDTLS_MPI_CHK( mbedtls_mpi_lset( Q, 0 ) );
        if( R != NULL ) MBEDTLS_MPI_CHK( mbedtls_mpi_copy( R, A ) );
        return( 0 );
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &X, A ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Y, B ) );
    X.s = Y.s = 1;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &Z, A->n + 2 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &Z,  0 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &T1, 2 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &T2, 3 ) );

    k = mbedtls_mpi_bitlen( &Y ) % biL;
    if( k < biL - 1 )
    {
        k = biL - 1 - k;
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &X, k ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &Y, k ) );
    }
    else k = 0;

    n = X.n - 1;
    t = Y.n - 1;
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &Y, biL * ( n - t ) ) );

    while( mbedtls_mpi_cmp_mpi( &X, &Y ) >= 0 )
    {
        Z.p[n - t]++;
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &X, &X, &Y ) );
    }
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &Y, biL * ( n - t ) ) );

    for( i = n; i > t ; i-- )
    {
        if( X.p[i] >= Y.p[t] )
            Z.p[i - t - 1] = ~0;
        else
        {
#if defined(MBEDTLS_HAVE_UDBL)
            mbedtls_t_udbl r;

            r  = (mbedtls_t_udbl) X.p[i] << biL;
            r |= (mbedtls_t_udbl) X.p[i - 1];
            r /= Y.p[t];
            if( r > ( (mbedtls_t_udbl) 1 << biL ) - 1 )
                r = ( (mbedtls_t_udbl) 1 << biL ) - 1;

            Z.p[i - t - 1] = (mbedtls_mpi_uint) r;
#else
            /*
             * __udiv_qrnnd_c, from gmp/longlong.h
             */
            mbedtls_mpi_uint q0, q1, r0, r1;
            mbedtls_mpi_uint d0, d1, d, m;

            d  = Y.p[t];
            d0 = ( d << biH ) >> biH;
            d1 = ( d >> biH );

            q1 = X.p[i] / d1;
            r1 = X.p[i] - d1 * q1;
            r1 <<= biH;
            r1 |= ( X.p[i - 1] >> biH );

            m = q1 * d0;
            if( r1 < m )
            {
                q1--, r1 += d;
                while( r1 >= d && r1 < m )
                    q1--, r1 += d;
            }
            r1 -= m;

            q0 = r1 / d1;
            r0 = r1 - d1 * q0;
            r0 <<= biH;
            r0 |= ( X.p[i - 1] << biH ) >> biH;

            m = q0 * d0;
            if( r0 < m )
            {
                q0--, r0 += d;
                while( r0 >= d && r0 < m )
                    q0--, r0 += d;
            }
            r0 -= m;

            Z.p[i - t - 1] = ( q1 << biH ) | q0;
#endif /* MBEDTLS_HAVE_UDBL && !64-bit Apple with Clang 5.0 */
        }

        Z.p[i - t - 1]++;
        do
        {
            Z.p[i - t - 1]--;

            MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &T1, 0 ) );
            T1.p[0] = ( t < 1 ) ? 0 : Y.p[t - 1];
            T1.p[1] = Y.p[t];
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &T1, &T1, Z.p[i - t - 1] ) );

            MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &T2, 0 ) );
            T2.p[0] = ( i < 2 ) ? 0 : X.p[i - 2];
            T2.p[1] = ( i < 1 ) ? 0 : X.p[i - 1];
            T2.p[2] = X.p[i];
        }
        while( mbedtls_mpi_cmp_mpi( &T1, &T2 ) > 0 );

        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &T1, &Y, Z.p[i - t - 1] ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &T1,  biL * ( i - t - 1 ) ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &X, &X, &T1 ) );

        if( mbedtls_mpi_cmp_int( &X, 0 ) < 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &T1, &Y ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &T1, biL * ( i - t - 1 ) ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &X, &X, &T1 ) );
            Z.p[i - t - 1]--;
        }
    }

    if( Q != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( Q, &Z ) );
        Q->s = A->s * B->s;
    }

    if( R != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &X, k ) );
        X.s = A->s;
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( R, &X ) );

        if( mbedtls_mpi_cmp_int( R, 0 ) == 0 )
            R->s = 1;
    }

cleanup:

    mbedtls_mpi_free( &X ); mbedtls_mpi_free( &Y ); mbedtls_mpi_free( &Z );
    mbedtls_mpi_free( &T1 ); mbedtls_mpi_free( &T2 );

    return( ret );
}